

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

quat golf_json_object_get_quat(JSON_Object *obj,char *name)

{
  quat qVar1;
  JSON_Array *array_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  JSON_Array *array;
  char *name_local;
  JSON_Object *obj_local;
  quat q;
  
  array_00 = json_object_get_array(obj,name);
  dVar2 = json_array_get_number(array_00,0);
  dVar3 = json_array_get_number(array_00,1);
  dVar4 = json_array_get_number(array_00,2);
  dVar5 = json_array_get_number(array_00,3);
  qVar1.y = (float)dVar3;
  qVar1.x = (float)dVar2;
  qVar1.z = (float)dVar4;
  qVar1.w = (float)dVar5;
  return qVar1;
}

Assistant:

quat golf_json_object_get_quat(JSON_Object *obj, const char *name) {
    JSON_Array *array = json_object_get_array(obj, name);
    quat q;
    q.x = (float)json_array_get_number(array, 0);
    q.y = (float)json_array_get_number(array, 1);
    q.z = (float)json_array_get_number(array, 2);
    q.w = (float)json_array_get_number(array, 3);
    return q;
}